

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O1

dev_t pack_freebsd(int n,u_long *numbers,char **error)

{
  u_long uVar1;
  uint uVar2;
  dev_t dVar3;
  char *pcVar4;
  uint uVar5;
  
  if (n == 2) {
    uVar1 = numbers[1];
    uVar2 = (uint)*numbers;
    uVar5 = (uint)uVar1 & 0xffff00ff;
    dVar3 = (ulong)((uVar2 & 0xff) << 8) + (ulong)uVar5;
    if (((ulong)(uVar2 & 0xff) == *numbers) && ((long)(int)uVar5 == uVar1)) {
      return dVar3;
    }
    pcVar4 = "invalid major number";
    if ((long)(int)uVar5 != uVar1) {
      pcVar4 = "invalid minor number";
    }
  }
  else {
    pcVar4 = "too many fields for format";
    dVar3 = 0;
  }
  *error = pcVar4;
  return dVar3;
}

Assistant:

static dev_t
pack_freebsd(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_freebsd(numbers[0], numbers[1]);
		if ((u_long)major_freebsd(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)minor_freebsd(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}